

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::CopySourceCodeInfoToTest::CopySourceCodeInfoToTest
          (CopySourceCodeInfoToTest *this)

{
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  CopySourceCodeInfoToTest *local_10;
  CopySourceCodeInfoToTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CopySourceCodeInfoToTest_029b9f58;
  AbortingErrorCollector::AbortingErrorCollector(&this->collector_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"/test/test.proto",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"syntax = \"proto2\";\nmessage Foo {}\n",&local_69);
  SingletonSourceTree::SingletonSourceTree(&this->source_tree_,&local_40,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  compiler::SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
            (&this->db_,&(this->source_tree_).super_SourceTree);
  DescriptorPool::DescriptorPool
            (&this->pool_,&(this->db_).super_DescriptorDatabase,
             &(this->collector_).super_ErrorCollector);
  return;
}

Assistant:

CopySourceCodeInfoToTest()
      : source_tree_("/test/test.proto", kCopySourceCodeInfoToTestInput),
        db_(&source_tree_),
        pool_(&db_, &collector_) {}